

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtcr(fitsfile *fptr,char *grpname,int grouptype,int *status)

{
  int iVar1;
  int *in_RCX;
  undefined4 in_EDX;
  fitsfile *in_RSI;
  int hdunum;
  int hdutype;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int in_stack_00000044;
  fitsfile *in_stack_00000048;
  int *in_stack_00000220;
  int in_stack_0000022c;
  char *in_stack_00000230;
  fitsfile *in_stack_00000238;
  undefined4 local_30;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 local_4;
  
  if (*in_RCX == 0) {
    iVar1 = ffthdu(in_RSI,(int *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),in_RCX);
    *in_RCX = iVar1;
    if (local_30 != 0) {
      iVar1 = ffmahd(in_stack_00000048,in_stack_00000044,in_stack_00000038,in_stack_00000030);
      *in_RCX = iVar1;
    }
    if (*in_RCX != 0) {
      *in_RCX = 0;
    }
    iVar1 = ffgtis(in_stack_00000238,in_stack_00000230,in_stack_0000022c,in_stack_00000220);
    *in_RCX = iVar1;
    local_4 = *in_RCX;
  }
  else {
    local_4 = *in_RCX;
  }
  return local_4;
}

Assistant:

int ffgtcr(fitsfile *fptr,      /* FITS file pointer                         */
	   char    *grpname,    /* name of the grouping table                */
	   int      grouptype,  /* code specifying the type of
				   grouping table information:
				   GT_ID_ALL_URI  0 ==> defualt (all columns)
				   GT_ID_REF      1 ==> ID by reference
				   GT_ID_POS      2 ==> ID by position
				   GT_ID_ALL      3 ==> ID by ref. and position
				   GT_ID_REF_URI 11 ==> (1) + URI info 
				   GT_ID_POS_URI 12 ==> (2) + URI info       */
	   int      *status    )/* return status code                        */

/* 
   create a grouping table at the end of the current FITS file. This
   function makes the last HDU in the file the CHDU, then calls the
   fits_insert_group() function to actually create the new grouping table.
*/

{
  int hdutype;
  int hdunum;


  if(*status != 0) return(*status);


  *status = fits_get_num_hdus(fptr,&hdunum,status);

  /* If hdunum is 0 then we are at the beginning of the file and
     we actually haven't closed the first header yet, so don't do
     anything more */

  if (0 != hdunum) {

      *status = fits_movabs_hdu(fptr,hdunum,&hdutype,status);
  }

  /* Now, the whole point of the above two fits_ calls was to get to
     the end of file.  Let's ignore errors at this point and keep
     going since any error is likely to mean that we are already at the 
     EOF, or the file is fatally corrupted.  If we are at the EOF then
     the next fits_ call will be ok.  If it's corrupted then the
     next call will fail, but that's not big deal at this point.
  */

  if (0 != *status ) *status = 0;

  *status = fits_insert_group(fptr,grpname,grouptype,status);

  return(*status);
}